

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::Utils::getBlockVariableDefinition_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,qualifierSet *qualifiers,GLchar *type_name,
          GLchar *variable_name)

{
  GLchar *pGVar1;
  GLchar *text;
  qualifierSet *qualifiers_00;
  string local_70;
  string *local_50;
  string *list;
  size_t position;
  allocator<char> local_2a;
  byte local_29;
  GLchar *local_28;
  GLchar *variable_name_local;
  GLchar *type_name_local;
  qualifierSet *qualifiers_local;
  string *variable_definition;
  
  pGVar1 = getBlockVariableDefinition::def_template;
  local_29 = 0;
  local_28 = type_name;
  variable_name_local = (GLchar *)qualifiers;
  type_name_local = (GLchar *)this;
  qualifiers_local = (qualifierSet *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pGVar1,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  list = (string *)0x0;
  getQualifiersListString_abi_cxx11_(&local_70,(Utils *)type_name_local,qualifiers_00);
  pGVar1 = getBlockVariableDefinition::token_qual_list;
  local_50 = &local_70;
  text = (GLchar *)std::__cxx11::string::c_str();
  replaceToken(pGVar1,(size_t *)&list,text,__return_storage_ptr__);
  replaceToken(getBlockVariableDefinition::token_type,(size_t *)&list,variable_name_local,
               __return_storage_ptr__);
  replaceToken(getBlockVariableDefinition::token_variable_name,(size_t *)&list,local_28,
               __return_storage_ptr__);
  local_29 = 1;
  std::__cxx11::string::~string((string *)&local_70);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getBlockVariableDefinition(const qualifierSet& qualifiers, const glw::GLchar* type_name,
											  const glw::GLchar* variable_name)
{
	/* Templates */
	static const GLchar* def_template = "QUALIFIER_LISTTYPE VARIABLE_NAME";

	/* Tokens */
	static const GLchar* token_type			 = "TYPE";
	static const GLchar* token_variable_name = "VARIABLE_NAME";
	static const GLchar* token_qual_list	 = "QUALIFIER_LIST";

	/* Variables */
	std::string variable_definition = def_template;
	size_t		position			= 0;

	/* Get qualifiers list */
	const std::string& list = getQualifiersListString(qualifiers);

	/* Replace tokens */
	Utils::replaceToken(token_qual_list, position, list.c_str(), variable_definition);
	Utils::replaceToken(token_type, position, type_name, variable_definition);
	Utils::replaceToken(token_variable_name, position, variable_name, variable_definition);

	/* Done */
	return variable_definition;
}